

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

int dump_callback(void *pArg,int nArg,char **azArg,char **azNotUsed)

{
  undefined4 uVar1;
  char *pcVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  char **azCol;
  char *pcVar6;
  FILE *__s;
  char *pcVar7;
  char **ppcVar8;
  size_t sStack_80;
  string sSelect;
  string sTable;
  
  if (azArg == (char **)0x0 || nArg != 3) {
    return 0;
  }
  pcVar6 = *azArg;
  pcVar2 = azArg[1];
  pcVar7 = azArg[2];
  iVar5 = strcmp(pcVar6,"sqlite_sequence");
  if (iVar5 == 0) {
    __s = *(FILE **)((long)pArg + 0x20);
    pcVar7 = "DELETE FROM sqlite_sequence;\n";
    sStack_80 = 0x1d;
LAB_001e2a51:
    fwrite(pcVar7,sStack_80,1,__s);
  }
  else {
    iVar5 = duckdb_shell_sqlite3_strglob("sqlite_stat?",pcVar6);
    if (iVar5 == 0) {
      __s = *(FILE **)((long)pArg + 0x20);
      pcVar7 = "ANALYZE sqlite_schema;\n";
      sStack_80 = 0x17;
      goto LAB_001e2a51;
    }
    iVar5 = strncmp(pcVar6,"sqlite_",7);
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = strncmp(pcVar7,"CREATE VIRTUAL TABLE",0x14);
    if (iVar5 == 0) {
      pcVar6 = duckdb_shell_sqlite3_mprintf
                         ("INSERT INTO sqlite_schema(type,name,tbl_name,rootpage,sql)VALUES(\'table\',\'%q\',\'%q\',0,\'%q\');"
                          ,pcVar6,pcVar6,pcVar7);
      fprintf(*(FILE **)((long)pArg + 0x20),"%s\n",pcVar6);
      duckdb_shell_sqlite3_free(pcVar6);
      return 0;
    }
    duckdb_shell::ShellState::PrintSchemaLine((ShellState *)pArg,pcVar7,";\n");
  }
  iVar5 = strcmp(pcVar2,"table");
  if (iVar5 != 0) {
    return 0;
  }
  sSelect._M_dataplus._M_p = (pointer)&sSelect.field_2;
  sSelect._M_string_length = 0;
  sSelect.field_2._M_local_buf[0] = '\0';
  sTable._M_dataplus._M_p = (pointer)&sTable.field_2;
  sTable._M_string_length = 0;
  sTable.field_2._M_local_buf[0] = '\0';
  azCol = duckdb_shell::ShellState::TableColumnList((ShellState *)pArg,pcVar6);
  if (azCol != (char **)0x0) {
    cVar4 = quoteChar(pcVar6);
    appendText(&sTable,pcVar6,cVar4);
    if (*azCol != (char *)0x0) {
      appendText(&sTable,"(",'\0');
      appendText(&sTable,*azCol,'\0');
      ppcVar8 = azCol;
      while (ppcVar8 = ppcVar8 + 1, *ppcVar8 != (char *)0x0) {
        appendText(&sTable,",",'\0');
        pcVar2 = *ppcVar8;
        cVar4 = quoteChar(pcVar2);
        appendText(&sTable,pcVar2,cVar4);
      }
      appendText(&sTable,")",'\0');
    }
    appendText(&sSelect,"SELECT ",'\0');
    if (*azCol != (char *)0x0) {
      appendText(&sSelect,*azCol,'\0');
      appendText(&sSelect,",",'\0');
    }
    for (ppcVar8 = azCol + 2; pcVar2 = ppcVar8[-1], pcVar2 != (char *)0x0; ppcVar8 = ppcVar8 + 1) {
      cVar4 = quoteChar(pcVar2);
      appendText(&sSelect,pcVar2,cVar4);
      if (*ppcVar8 != (char *)0x0) {
        appendText(&sSelect,",",'\0');
      }
    }
    freeColumnList(azCol);
    appendText(&sSelect," FROM ",'\0');
    cVar4 = quoteChar(pcVar6);
    appendText(&sSelect,pcVar6,cVar4);
    uVar3 = *(undefined8 *)((long)pArg + 0x50);
    uVar1 = *(undefined4 *)((long)pArg + 0x2c);
    *(pointer *)((long)pArg + 0x50) = sTable._M_dataplus._M_p;
    *(undefined4 *)((long)pArg + 0x34) = 5;
    *(undefined4 *)((long)pArg + 0x2c) = 5;
    iVar5 = duckdb_shell::ShellState::ExecuteSQL
                      ((ShellState *)pArg,sSelect._M_dataplus._M_p,(char **)0x0);
    if ((char)iVar5 == '\v') {
      fwrite("/****** CORRUPTION ERROR *******/\n",0x22,1,*(FILE **)((long)pArg + 0x20));
      toggleSelectOrder(*pArg);
      duckdb_shell::ShellState::ExecuteSQL((ShellState *)pArg,sSelect._M_dataplus._M_p,(char **)0x0)
      ;
      toggleSelectOrder(*pArg);
      *(undefined8 *)((long)pArg + 0x50) = uVar3;
      *(undefined4 *)((long)pArg + 0x2c) = uVar1;
    }
    else {
      *(undefined8 *)((long)pArg + 0x50) = uVar3;
      *(undefined4 *)((long)pArg + 0x2c) = uVar1;
      if (iVar5 == 0) goto LAB_001e2cbd;
    }
  }
  *(int *)((long)pArg + 0x28) = *(int *)((long)pArg + 0x28) + 1;
LAB_001e2cbd:
  std::__cxx11::string::~string((string *)&sTable);
  std::__cxx11::string::~string((string *)&sSelect);
  return 0;
}

Assistant:

static int dump_callback(void *pArg, int nArg, char **azArg, char **azNotUsed) {
	int rc;
	const char *zTable;
	const char *zType;
	const char *zSql;
	ShellState *p = (ShellState *)pArg;

	UNUSED_PARAMETER(azNotUsed);
	if (nArg != 3 || azArg == 0)
		return 0;
	zTable = azArg[0];
	zType = azArg[1];
	zSql = azArg[2];

	if (strcmp(zTable, "sqlite_sequence") == 0) {
		raw_printf(p->out, "DELETE FROM sqlite_sequence;\n");
	} else if (sqlite3_strglob("sqlite_stat?", zTable) == 0) {
		raw_printf(p->out, "ANALYZE sqlite_schema;\n");
	} else if (strncmp(zTable, "sqlite_", 7) == 0) {
		return 0;
	} else if (strncmp(zSql, "CREATE VIRTUAL TABLE", 20) == 0) {
		char *zIns;
		zIns = sqlite3_mprintf("INSERT INTO sqlite_schema(type,name,tbl_name,rootpage,sql)"
		                       "VALUES('table','%q','%q',0,'%q');",
		                       zTable, zTable, zSql);
		utf8_printf(p->out, "%s\n", zIns);
		sqlite3_free(zIns);
		return 0;
	} else {
		p->PrintSchemaLine(zSql, ";\n");
	}

	if (strcmp(zType, "table") == 0) {
		string sSelect;
		string sTable;
		char **azCol;
		int i;
		char *savedDestTable;
		RenderMode savedMode;

		azCol = p->TableColumnList(zTable);
		if (azCol == 0) {
			p->nErr++;
			return 0;
		}

		/* Always quote the table name, even if it appears to be pure ascii,
		** in case it is a keyword. Ex:  INSERT INTO "table" ... */
		appendText(sTable, zTable, quoteChar(zTable));
		/* If preserving the rowid, add a column list after the table name.
		** In other words:  "INSERT INTO tab(rowid,a,b,c,...) VALUES(...)"
		** instead of the usual "INSERT INTO tab VALUES(...)".
		*/
		if (azCol[0]) {
			appendText(sTable, "(", 0);
			appendText(sTable, azCol[0], 0);
			for (i = 1; azCol[i]; i++) {
				appendText(sTable, ",", 0);
				appendText(sTable, azCol[i], quoteChar(azCol[i]));
			}
			appendText(sTable, ")", 0);
		}

		/* Build an appropriate SELECT statement */
		appendText(sSelect, "SELECT ", 0);
		if (azCol[0]) {
			appendText(sSelect, azCol[0], 0);
			appendText(sSelect, ",", 0);
		}
		for (i = 1; azCol[i]; i++) {
			appendText(sSelect, azCol[i], quoteChar(azCol[i]));
			if (azCol[i + 1]) {
				appendText(sSelect, ",", 0);
			}
		}
		freeColumnList(azCol);
		appendText(sSelect, " FROM ", 0);
		appendText(sSelect, zTable, quoteChar(zTable));

		savedDestTable = p->zDestTable;
		savedMode = p->mode;
		p->zDestTable = (char *)sTable.c_str();
		p->mode = p->cMode = RenderMode::INSERT;
		rc = p->ExecuteSQL(sSelect.c_str(), 0);
		if ((rc & 0xff) == SQLITE_CORRUPT) {
			raw_printf(p->out, "/****** CORRUPTION ERROR *******/\n");
			toggleSelectOrder(p->db);
			p->ExecuteSQL(sSelect.c_str(), 0);
			toggleSelectOrder(p->db);
		}
		p->zDestTable = savedDestTable;
		p->mode = savedMode;
		if (rc)
			p->nErr++;
	}
	return 0;
}